

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O0

optional<int> __thiscall
slang::ast::ASTContext::evalInteger
          (ASTContext *this,Expression *expr,bitmask<slang::ast::EvalFlags> extraFlags)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange sourceRange;
  bool bVar1;
  undefined1 uVar2;
  SourceLocation SVar3;
  _Optional_payload_base<int> this_00;
  Diagnostic *this_01;
  Diagnostic *diag;
  SVInt *value;
  ConstantValue cv;
  optional<int> coerced;
  Expression *in_stack_00000268;
  ASTContext *in_stack_00000270;
  bitmask<slang::ast::EvalFlags> in_stack_0000027f;
  ConstantValue *in_stack_fffffffffffffec8;
  Diagnostic *pDVar4;
  int arg;
  ConstantValue *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  SourceLocation in_stack_fffffffffffffef0;
  ASTContext *in_stack_fffffffffffffef8;
  SourceLocation SVar5;
  undefined4 in_stack_ffffffffffffff04;
  DiagCode code;
  undefined1 local_50 [72];
  _Optional_payload_base<int> local_8;
  
  bVar1 = requireIntegral(in_stack_fffffffffffffef8,(Expression *)in_stack_fffffffffffffef0);
  if (bVar1) {
    SVar5 = (SourceLocation)local_50;
    eval(in_stack_00000270,in_stack_00000268,in_stack_0000027f);
    range.endLoc = SVar5;
    range.startLoc = in_stack_fffffffffffffef0;
    bVar1 = requireIntegral((ASTContext *)
                            CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                            in_stack_fffffffffffffee0,range);
    code._0_3_ = (undefined3)in_stack_ffffffffffffff04;
    code.code._1_1_ = bVar1;
    if (bVar1) {
      SVar3 = (SourceLocation)slang::ConstantValue::integer((ConstantValue *)0x4a851b);
      range_00.endLoc = SVar5;
      range_00.startLoc = SVar3;
      uVar2 = requireNoUnknowns((ASTContext *)
                                CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                                (SVInt *)in_stack_fffffffffffffee0,range_00);
      if ((bool)uVar2) {
        this_00 = (_Optional_payload_base<int>)
                  SVInt::as<int>((SVInt *)CONCAT17(uVar2,in_stack_fffffffffffffee8));
        local_8 = this_00;
        bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x4a85c0);
        if (!bVar1) {
          sourceRange.endLoc = SVar5;
          sourceRange.startLoc = SVar3;
          this_01 = addDiag((ASTContext *)CONCAT17(uVar2,in_stack_fffffffffffffee8),code,sourceRange
                           );
          pDVar4 = this_01;
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)this_01,(SVInt *)in_stack_fffffffffffffec8);
          arg = (int)((ulong)pDVar4 >> 0x20);
          Diagnostic::operator<<(this_01,in_stack_fffffffffffffec8);
          slang::ConstantValue::~ConstantValue((ConstantValue *)0x4a864f);
          Diagnostic::operator<<<int>((Diagnostic *)this_00,arg);
          Diagnostic::operator<<<int>((Diagnostic *)this_00,arg);
        }
      }
      else {
        std::optional<int>::optional((optional<int> *)&local_8);
      }
    }
    else {
      std::optional<int>::optional((optional<int> *)&local_8);
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x4a86b1);
  }
  else {
    std::optional<int>::optional((optional<int> *)&local_8);
  }
  return (optional<int>)local_8;
}

Assistant:

std::optional<int32_t> ASTContext::evalInteger(const Expression& expr,
                                               bitmask<EvalFlags> extraFlags) const {
    if (!requireIntegral(expr))
        return std::nullopt;

    ConstantValue cv = eval(expr, extraFlags);
    if (!requireIntegral(cv, expr.sourceRange))
        return std::nullopt;

    const SVInt& value = cv.integer();
    if (!requireNoUnknowns(value, expr.sourceRange))
        return std::nullopt;

    auto coerced = value.as<int32_t>();
    if (!coerced) {
        auto& diag = addDiag(diag::ValueOutOfRange, expr.sourceRange);
        diag << value;
        diag << INT32_MIN;
        diag << INT32_MAX;
    }
    return coerced;
}